

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

Ptr __thiscall SimpleSyntaxAnalyzer::analyze(SimpleSyntaxAnalyzer *this,TokenReader *tokens)

{
  SimpleASTNode *this_00;
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Ptr PVar3;
  int local_a0;
  Token token;
  SimpleASTNode *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_68 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  Ptr local_48;
  undefined1 local_31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  TokenReader::peek();
  _Var2._M_pi = extraout_RDX;
  if (local_a0 != 0x10) {
    if (local_a0 == 2) {
      TokenReader::read();
      std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_68);
      if (a_Stack_68[0]._M_pi != &local_58) {
        operator_delete(a_Stack_68[0]._M_pi);
      }
      token.val.field_2._12_4_ = 0;
      local_70 = (SimpleASTNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                (a_Stack_68,&local_70,(allocator<SimpleASTNode> *)&local_31,
                 (ASTNodeType *)(token.val.field_2._M_local_buf + 0xc),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
      *(SimpleASTNode **)this = local_70;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = a_Stack_68[0]._M_pi;
      while( true ) {
        cVar1 = TokenReader::end();
        _Var2._M_pi = extraout_RDX_00;
        if (cVar1 != '\0') break;
        express((TokenReader *)&local_70);
        _Var2._M_pi = a_Stack_68[0]._M_pi;
        this_00 = *(SimpleASTNode **)this;
        local_48.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_70;
        local_48.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             a_Stack_68[0]._M_pi;
        if (a_Stack_68[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (a_Stack_68[0]._M_pi)->_M_use_count = (a_Stack_68[0]._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (a_Stack_68[0]._M_pi)->_M_use_count = (a_Stack_68[0]._M_pi)->_M_use_count + 1;
          }
        }
        SimpleASTNode::addChild(this_00,&local_48);
        if (local_48.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
      }
    }
    else {
      PVar3 = express((TokenReader *)&local_70);
      _Var2 = PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      *(SimpleASTNode **)this = local_70;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = a_Stack_68[0]._M_pi;
    }
  }
  if ((size_type *)token._0_8_ != &token.val._M_string_length) {
    operator_delete((void *)token._0_8_);
    _Var2._M_pi = extraout_RDX_01;
  }
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SimpleASTNode::Ptr SimpleSyntaxAnalyzer::analyze(TokenReader& tokens)
{
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    if (!token.isEmpty()) {
        if (token.type == TokenType::KEY_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create(ASTNodeType::DECLARATION, token.val);
            while (!tokens.end()) {
                SimpleASTNode::Ptr child;
                child = express(tokens);
                node->addChild(child);
            }
        } else {
            node = express(tokens);
        }
    }
    return node;
}